

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapDevice.cpp
# Opt level: O3

void __thiscall TRM::BitmapDevice::BitmapDevice(BitmapDevice *this,shared_ptr<TRM::Bitmap> *bitmap)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  value_type_conflict3 local_1c;
  
  (this->super_Device)._vptr_Device = (_func_int **)&PTR__BitmapDevice_00125d30;
  (this->mBitmap).super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (bitmap->super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (bitmap->super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (bitmap->super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mBitmap).super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->mBitmap).super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (bitmap->super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  (this->mZBuffer).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->mZBuffer).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->mZBuffer).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->mMatrix).value[0].field_0.x = 1.0;
  (this->mMatrix).value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  (this->mMatrix).value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  *(undefined8 *)&(this->mMatrix).value[0].field_3 = 0;
  (this->mMatrix).value[1].field_1.y = 1.0;
  (this->mMatrix).value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  (this->mMatrix).value[1].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  (this->mMatrix).value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  (this->mMatrix).value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  (this->mMatrix).value[2].field_2.z = 1.0;
  *(undefined8 *)&(this->mMatrix).value[2].field_3 = 0;
  (this->mMatrix).value[3].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  (this->mMatrix).value[3].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  (this->mMatrix).value[3].field_3.w = 1.0;
  peVar1 = (this->mBitmap).super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<float,_std::allocator<float>_>::resize
            (&this->mZBuffer,(ulong)(peVar1->fHeight * peVar1->fWidth));
  local_1c = 3.4028235e+38;
  std::vector<float,_std::allocator<float>_>::_M_fill_assign
            (&this->mZBuffer,
             (long)(this->mZBuffer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->mZBuffer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_1c);
  return;
}

Assistant:

BitmapDevice::BitmapDevice(std::shared_ptr<Bitmap> bitmap)
    : Device(), mBitmap(std::move(bitmap)) {
  mMatrix = IdentityMatrix();
  mZBuffer.resize(mBitmap->width() * mBitmap->height());
  mZBuffer.assign(mZBuffer.size(), std::numeric_limits<float>::max());
}